

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxPtrs.h
# Opt level: O0

void * Js::AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>::GetAuxPtr
                 (FunctionProxy *host,AuxPointerType e)

{
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *this;
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> **ppAVar1;
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *tmpAuxPtrs;
  AuxPointerType e_local;
  FunctionProxy *host_local;
  
  ppAVar1 = Memory::PointerValue<Js::AuxPtrs<Js::FunctionProxy,Js::FunctionProxy::AuxPointerType>>
                      (&host->auxPtrs);
  this = *ppAVar1;
  if (this->count == '\x01') {
    host_local = (FunctionProxy *)
                 AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)'\x10',_(unsigned_char)'\x01'>
                 ::Get((AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)__x10_,_(unsigned_char)__x01_>
                        *)this,e);
  }
  else if (this->count == '\x03') {
    host_local = (FunctionProxy *)
                 AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)'_',_(unsigned_char)'\x03'>
                 ::Get((AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)___,_(unsigned_char)__x03_>
                        *)this,e);
  }
  else {
    host_local = (FunctionProxy *)Get(this,e);
  }
  return host_local;
}

Assistant:

inline void* AuxPtrs<T, FieldsEnum>::GetAuxPtr(const T* host, FieldsEnum e)
    {
        auto tmpAuxPtrs = PointerValue(host->auxPtrs);
        if (tmpAuxPtrs->count == AuxPtrs16::MaxCount)
        {
            return ((AuxPtrs16*)(void*)tmpAuxPtrs)->Get(e);
        }
        if (tmpAuxPtrs->count == AuxPtrs32::MaxCount)
        {
            return ((AuxPtrs32*)(void*)tmpAuxPtrs)->Get(e);
        }
        return tmpAuxPtrs->Get(e);
    }